

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlSetValidErrors(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 *__s;
  undefined8 *local_60;
  xmlValidCtxtPyCtxtPtr pyCtxt;
  xmlValidCtxtPtr ctxt;
  PyObject *pyobj_arg;
  PyObject *pyobj_ctx;
  PyObject *pyobj_warn;
  PyObject *pyobj_error;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  ctxt = (xmlValidCtxtPtr)&_Py_NoneStruct;
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOO|O:xmlSetValidErrors",&pyobj_arg,&pyobj_warn,&pyobj_ctx,&ctxt);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (pyobj_arg == (PyObject *)&_Py_NoneStruct) {
      local_60 = (undefined8 *)0x0;
    }
    else {
      local_60 = (undefined8 *)pyobj_arg[1].ob_refcnt;
    }
    __s = (undefined8 *)(*_xmlMalloc)(0x18);
    if (__s == (undefined8 *)0x0) {
      self_local = libxml_intWrap(-1);
    }
    else {
      memset(__s,0,0x18);
      _Py_XDECREF((PyObject *)__s[1]);
      _Py_XINCREF(pyobj_warn);
      __s[1] = pyobj_warn;
      _Py_XDECREF((PyObject *)*__s);
      _Py_XINCREF(pyobj_ctx);
      *__s = pyobj_ctx;
      _Py_XDECREF((PyObject *)__s[2]);
      _Py_XINCREF((PyObject *)ctxt);
      __s[2] = ctxt;
      local_60[1] = libxml_xmlValidCtxtErrorFuncHandler;
      local_60[2] = libxml_xmlValidCtxtWarningFuncHandler;
      *local_60 = __s;
      self_local = libxml_intWrap(1);
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlSetValidErrors(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval;
    PyObject *pyobj_error;
    PyObject *pyobj_warn;
    PyObject *pyobj_ctx;
    PyObject *pyobj_arg = Py_None;
    xmlValidCtxtPtr ctxt;
    xmlValidCtxtPyCtxtPtr pyCtxt;

    if (!PyArg_ParseTuple
        (args, (char *) "OOO|O:xmlSetValidErrors", &pyobj_ctx, &pyobj_error, &pyobj_warn, &pyobj_arg))
        return (NULL);

#ifdef DEBUG_ERROR
    printf("libxml_xmlSetValidErrors(%p, %p, %p) called\n", pyobj_ctx, pyobj_error, pyobj_warn);
#endif

    ctxt = PyValidCtxt_Get(pyobj_ctx);
    pyCtxt = xmlMalloc(sizeof(xmlValidCtxtPyCtxt));
    if (pyCtxt == NULL) {
            py_retval = libxml_intWrap(-1);
            return(py_retval);
    }
    memset(pyCtxt, 0, sizeof(xmlValidCtxtPyCtxt));

    
    /* TODO: check warn and error is a function ! */
    Py_XDECREF(pyCtxt->error);
    Py_XINCREF(pyobj_error);
    pyCtxt->error = pyobj_error;
    
    Py_XDECREF(pyCtxt->warn);
    Py_XINCREF(pyobj_warn);
    pyCtxt->warn = pyobj_warn;
    
    Py_XDECREF(pyCtxt->arg);
    Py_XINCREF(pyobj_arg);
    pyCtxt->arg = pyobj_arg;

    ctxt->error = libxml_xmlValidCtxtErrorFuncHandler;
    ctxt->warning = libxml_xmlValidCtxtWarningFuncHandler;
    ctxt->userData = pyCtxt;

    py_retval = libxml_intWrap(1);
    return (py_retval);
}